

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O1

void wipeout_text(char *engr,int cnt,uint seed)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  char cVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  
  uVar9 = (ulong)seed;
  sVar3 = strlen(engr);
  iVar2 = (int)sVar3;
  if (0 < cnt && iVar2 != 0) {
    do {
      if ((int)uVar9 == 0) {
        uVar8 = mt_random();
        uVar9 = 0;
        iVar10 = SUB164(ZEXT416(uVar8) % SEXT816((long)iVar2),0);
        uVar8 = mt_random();
      }
      else {
        iVar10 = (int)(uVar9 % (sVar3 & 0xffffffff));
        uVar8 = (int)uVar9 * 0x1f;
        uVar8 = uVar8 / 0xff + (uVar8 / 0xff) * -0x100 + uVar8;
        uVar9 = (ulong)uVar8;
      }
      cVar1 = engr[iVar10];
      if (cVar1 != 0x20) {
        pvVar4 = memchr("?.,\'`-|_",(int)cVar1,9);
        cVar6 = ' ';
        if (pvVar4 == (void *)0x0) {
          bVar12 = true;
          if ((uVar8 & 3) != 0) {
            lVar11 = 8;
            do {
              if (cVar1 == *(char *)((long)ends + lVar11 + 0x88)) {
                if ((int)uVar9 == 0) {
                  sVar5 = strlen(*(char **)(&rubouts[0].wipefrom + lVar11));
                  uVar8 = mt_random();
                  uVar9 = 0;
                  uVar7 = SUB168(ZEXT416(uVar8) % SEXT816((long)(int)sVar5),0);
                }
                else {
                  uVar8 = (int)uVar9 * 0x1f;
                  uVar9 = (ulong)(uVar8 / 0xff + (uVar8 / 0xff) * -0x100 + uVar8);
                  sVar5 = strlen(*(char **)(&rubouts[0].wipefrom + lVar11));
                  uVar7 = uVar9 % sVar5;
                }
                engr[iVar10] = *(char *)(*(long *)(&rubouts[0].wipefrom + lVar11) +
                                        (uVar7 & 0xffffffff));
                bVar12 = lVar11 == 0x2b8;
                break;
              }
              lVar11 = lVar11 + 0x10;
            } while (lVar11 != 0x2b8);
          }
          cVar6 = '?';
          if (!bVar12) goto LAB_0019834c;
        }
        engr[iVar10] = cVar6;
      }
LAB_0019834c:
      cnt = cnt + -1;
    } while (cnt != 0);
  }
  if (iVar2 != 0) {
    lVar11 = (long)iVar2;
    do {
      if (engr[lVar11 + -1] != ' ') {
        return;
      }
      engr[lVar11 + -1] = '\0';
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  return;
}

Assistant:

void wipeout_text(char *engr,
		  int cnt,
		  unsigned seed) /* for semi-controlled randomization */
{
	char *s;
	int i, j, nxt, use_rubout, lth = (int)strlen(engr);

	if (lth && cnt > 0) {
	    while (cnt--) {
		/* pick next character */
		if (!seed) {
		    /* random */
		    nxt = rn2(lth);
		    use_rubout = rn2(4);
		} else {
		    /* predictable; caller can reproduce the same sequence by
		       supplying the same arguments later, or a pseudo-random
		       sequence by varying any of them */
		    nxt = seed % lth;
		    seed *= 31,  seed %= (BUFSZ-1);
		    use_rubout = seed & 3;
		}
		s = &engr[nxt];
		if (*s == ' ') continue;

		/* rub out unreadable & small punctuation marks */
		if (strchr("?.,'`-|_", *s)) {
		    *s = ' ';
		    continue;
		}

		if (!use_rubout)
		    i = SIZE(rubouts);
		else
		    for (i = 0; i < SIZE(rubouts); i++)
			if (*s == rubouts[i].wipefrom) {
			    /*
			     * Pick one of the substitutes at random.
			     */
			    if (!seed)
				j = rn2(strlen(rubouts[i].wipeto));
			    else {
				seed *= 31,  seed %= (BUFSZ-1);
				j = seed % (strlen(rubouts[i].wipeto));
			    }
			    *s = rubouts[i].wipeto[j];
			    break;
			}

		/* didn't pick rubout; use '?' for unreadable character */
		if (i == SIZE(rubouts)) *s = '?';
	    }
	}

	/* trim trailing spaces */
	while (lth && engr[lth-1] == ' ') engr[--lth] = 0;
}